

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

void inven_inuse(boolean quietly)

{
  obj *poVar1;
  char *pcVar2;
  obj *otmp2;
  obj *otmp;
  boolean quietly_local;
  
  otmp2 = invent;
  poVar1 = otmp2;
  while (otmp2 = poVar1, otmp2 != (obj *)0x0) {
    poVar1 = otmp2->nobj;
    if ((*(uint *)&otmp2->field_0x4a >> 0x17 & 1) != 0) {
      if (quietly == '\0') {
        pcVar2 = xname(otmp2);
        pline("Finishing off %s...",pcVar2);
      }
      useup(otmp2);
    }
  }
  return;
}

Assistant:

void inven_inuse(boolean quietly)
{
	struct obj *otmp, *otmp2;

	for (otmp = invent; otmp; otmp = otmp2) {
	    otmp2 = otmp->nobj;
	    if (otmp->in_use) {
		if (!quietly) pline("Finishing off %s...", xname(otmp));
		useup(otmp);
	    }
	}
}